

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::CreateDefaultGlobalGenerator(cmake *this)

{
  cmGlobalGenerator *in_RAX;
  cmGlobalGenerator *local_18;
  
  local_18 = in_RAX;
  EvaluateDefaultGlobalGenerator((cmake *)&stack0xffffffffffffffe8);
  SetGlobalGenerator(this,local_18);
  return;
}

Assistant:

void cmake::CreateDefaultGlobalGenerator()
{
  auto gen = this->EvaluateDefaultGlobalGenerator();
#if defined(_WIN32) && !defined(__CYGWIN__) && !defined(CMAKE_BOOT_MINGW)
  // This print could be unified for all platforms
  std::cout << "-- Building for: " << gen->GetName() << "\n";
#endif
  this->SetGlobalGenerator(gen.release());
}